

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hopTruth.c
# Opt level: O3

uint * Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *pObj,Vec_Int_t *vTruth,int nWords)

{
  int iVar1;
  uint *puVar2;
  uint *puVar3;
  long lVar4;
  uint *puVar5;
  ulong uVar6;
  
  if (((ulong)pObj & 1) != 0) {
    __assert_fail("!Hop_IsComplement(pObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopTruth.c"
                  ,0x65,"unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)"
                 );
  }
  if ((*(uint *)&pObj->field_0x20 & 0x16) != 0x14) {
    return (uint *)(pObj->field_0).pData;
  }
  puVar2 = Hop_ManConvertAigToTruth_rec2
                     ((Hop_Obj_t *)((ulong)pObj->pFanin0 & 0xfffffffffffffffe),vTruth,nWords);
  puVar3 = Hop_ManConvertAigToTruth_rec2
                     ((Hop_Obj_t *)((ulong)pObj->pFanin1 & 0xfffffffffffffffe),vTruth,nWords);
  if (nWords == 0) {
    puVar5 = (uint *)0x0;
    if ((*(uint *)&pObj->field_0x20 & 7) == 5) goto LAB_0076c287;
  }
  else {
    if (nWords < 1) {
      __assert_fail("nWords > 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/misc/vec/vecInt.h"
                    ,0x37f,"unsigned int *Vec_IntFetch(Vec_Int_t *, int)");
    }
    lVar4 = (long)nWords + (long)vTruth->nSize;
    iVar1 = (int)lVar4;
    vTruth->nSize = iVar1;
    if (vTruth->nCap < iVar1) {
      puVar5 = (uint *)0x0;
    }
    else {
      puVar5 = (uint *)(vTruth->pArray + (lVar4 - (ulong)(uint)nWords));
    }
    if ((*(uint *)&pObj->field_0x20 & 7) == 5) {
      uVar6 = 0;
      do {
        puVar5[uVar6] = puVar3[uVar6] ^ puVar2[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
      goto LAB_0076c287;
    }
  }
  if (((ulong)pObj->pFanin0 & 1) == 0) {
    if (((ulong)pObj->pFanin1 & 1) == 0) {
      if (nWords != 0) {
        uVar6 = 0;
        do {
          puVar5[uVar6] = puVar3[uVar6] & puVar2[uVar6];
          uVar6 = uVar6 + 1;
        } while ((uint)nWords != uVar6);
      }
    }
    else if (nWords != 0) {
      uVar6 = 0;
      do {
        puVar5[uVar6] = ~puVar3[uVar6] & puVar2[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
    }
  }
  else if (((ulong)pObj->pFanin1 & 1) == 0) {
    if (nWords != 0) {
      uVar6 = 0;
      do {
        puVar5[uVar6] = ~puVar2[uVar6] & puVar3[uVar6];
        uVar6 = uVar6 + 1;
      } while ((uint)nWords != uVar6);
    }
  }
  else if (nWords != 0) {
    uVar6 = 0;
    do {
      puVar5[uVar6] = ~(puVar3[uVar6] | puVar2[uVar6]);
      uVar6 = uVar6 + 1;
    } while ((uint)nWords != uVar6);
  }
LAB_0076c287:
  if ((*(uint *)&pObj->field_0x20 & 0x10) != 0) {
    *(uint *)&pObj->field_0x20 = *(uint *)&pObj->field_0x20 & 0xffffffef;
    (pObj->field_0).pData = puVar5;
    return puVar5;
  }
  __assert_fail("Hop_ObjIsMarkA(pObj)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/hop/hopTruth.c"
                ,0x7c,"unsigned int *Hop_ManConvertAigToTruth_rec2(Hop_Obj_t *, Vec_Int_t *, int)");
}

Assistant:

unsigned * Hop_ManConvertAigToTruth_rec2( Hop_Obj_t * pObj, Vec_Int_t * vTruth, int nWords )
{
    unsigned * pTruth, * pTruth0, * pTruth1;
    int i;
    assert( !Hop_IsComplement(pObj) );
    if ( !Hop_ObjIsNode(pObj) || !Hop_ObjIsMarkA(pObj) )
        return (unsigned *)pObj->pData;
    // compute the truth tables of the fanins
    pTruth0 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin0(pObj), vTruth, nWords );
    pTruth1 = Hop_ManConvertAigToTruth_rec2( Hop_ObjFanin1(pObj), vTruth, nWords );
    // creat the truth table of the node
    pTruth  = Vec_IntFetch( vTruth, nWords );
    if ( Hop_ObjIsExor(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] ^ pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & pTruth1[i];
    else if ( !Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = pTruth0[i] & ~pTruth1[i];
    else if ( Hop_ObjFaninC0(pObj) && !Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & pTruth1[i];
    else // if ( Hop_ObjFaninC0(pObj) && Hop_ObjFaninC1(pObj) )
        for ( i = 0; i < nWords; i++ )
            pTruth[i] = ~pTruth0[i] & ~pTruth1[i];
    assert( Hop_ObjIsMarkA(pObj) ); // loop detection
    Hop_ObjClearMarkA( pObj );
    pObj->pData = pTruth;
    return pTruth;
}